

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

Interpolator QVariantAnimationPrivate::getInterpolator(int interpolationType)

{
  long lVar1;
  bool bVar2;
  Type *this;
  qsizetype qVar3;
  const_reference pp_Var4;
  int in_EDI;
  long in_FS_OFFSET;
  Interpolator ret;
  QInterpolatorVector *interpolators;
  scoped_lock<QBasicMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
  *in_stack_ffffffffffffffa8;
  QList<QVariant_(*)(const_void_*,_const_void_*,_double)> *in_stack_ffffffffffffffb0;
  _func_QVariant_void_ptr_void_ptr_double *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_registeredInterpolators>_>
         ::operator()(in_stack_ffffffffffffffa8);
  (anonymous_namespace)::qt_scoped_lock<QBasicMutex,std::scoped_lock<QBasicMutex>>
            ((QBasicMutex *)in_stack_ffffffffffffffa8);
  qVar3 = QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::size(this);
  if (in_EDI < qVar3) {
    pp_Var4 = QList<QVariant_(*)(const_void_*,_const_void_*,_double)>::at
                        (in_stack_ffffffffffffffb0,(qsizetype)in_stack_ffffffffffffffa8);
    if (*pp_Var4 != (_func_QVariant_void_ptr_void_ptr_double *)0x0) {
      bVar2 = true;
      local_18 = *pp_Var4;
      goto LAB_0068d97f;
    }
  }
  bVar2 = false;
LAB_0068d97f:
  std::scoped_lock<QBasicMutex>::~scoped_lock((scoped_lock<QBasicMutex> *)0x68d989);
  if (!bVar2) {
    switch(in_EDI) {
    case 2:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<int>_QVariant____int_const__int_const__double___
                           (_q_interpolateVariant<int>);
      break;
    case 3:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<unsigned_int>_QVariant____unsigned_int_const__unsigned_int_const__double___
                           (_q_interpolateVariant<unsigned_int>);
      break;
    default:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)0x0;
      break;
    case 6:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<double>_QVariant____double_const__double_const__double___
                           (_q_interpolateVariant<double>);
      break;
    case 0x13:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QRect>_QVariant____QRect_const__QRect_const__double___
                           (_q_interpolateVariant<QRect>);
      break;
    case 0x14:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QRectF>_QVariant____QRectF_const__QRectF_const__double___
                           (_q_interpolateVariant<QRectF>);
      break;
    case 0x15:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QSize>_QVariant____QSize_const__QSize_const__double___
                           (_q_interpolateVariant<QSize>);
      break;
    case 0x16:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QSizeF>_QVariant____QSizeF_const__QSizeF_const__double___
                           (_q_interpolateVariant<QSizeF>);
      break;
    case 0x17:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QLine>_QVariant____QLine_const__QLine_const__double___
                           (_q_interpolateVariant<QLine>);
      break;
    case 0x18:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QLineF>_QVariant____QLineF_const__QLineF_const__double___
                           (_q_interpolateVariant<QLineF>);
      break;
    case 0x19:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QPoint>_QVariant____QPoint_const__QPoint_const__double___
                           (_q_interpolateVariant<QPoint>);
      break;
    case 0x1a:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<QPointF>_QVariant____QPointF_const__QPointF_const__double___
                           (_q_interpolateVariant<QPointF>);
      break;
    case 0x26:
      local_18 = (_func_QVariant_void_ptr_void_ptr_double *)
                 __castToInterpolator<float>_QVariant____float_const__float_const__double___
                           (_q_interpolateVariant<float>);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Interpolator)local_18;
  }
  __stack_chk_fail();
}

Assistant:

QVariantAnimation::Interpolator QVariantAnimationPrivate::getInterpolator(int interpolationType)
{
    {
        QInterpolatorVector *interpolators = registeredInterpolators();
        const auto locker = qt_scoped_lock(registeredInterpolatorsMutex);
        QVariantAnimation::Interpolator ret = nullptr;
        if (interpolationType < interpolators->size()) {
            ret = interpolators->at(interpolationType);
            if (ret) return ret;
        }
    }

    switch(interpolationType)
    {
    case QMetaType::Int:
        return castToInterpolator(_q_interpolateVariant<int>);
    case QMetaType::UInt:
        return castToInterpolator(_q_interpolateVariant<uint>);
    case QMetaType::Double:
        return castToInterpolator(_q_interpolateVariant<double>);
    case QMetaType::Float:
        return castToInterpolator(_q_interpolateVariant<float>);
    case QMetaType::QLine:
        return castToInterpolator(_q_interpolateVariant<QLine>);
    case QMetaType::QLineF:
        return castToInterpolator(_q_interpolateVariant<QLineF>);
    case QMetaType::QPoint:
        return castToInterpolator(_q_interpolateVariant<QPoint>);
    case QMetaType::QPointF:
        return castToInterpolator(_q_interpolateVariant<QPointF>);
    case QMetaType::QSize:
        return castToInterpolator(_q_interpolateVariant<QSize>);
    case QMetaType::QSizeF:
        return castToInterpolator(_q_interpolateVariant<QSizeF>);
    case QMetaType::QRect:
        return castToInterpolator(_q_interpolateVariant<QRect>);
    case QMetaType::QRectF:
        return castToInterpolator(_q_interpolateVariant<QRectF>);
    default:
        return nullptr; //this type is not handled
    }
}